

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_CDict *pZVar1;
  ZSTD_CCtx_params params_00;
  ZSTD_CCtx_params params_01;
  size_t sVar2;
  void *pvVar3;
  ZSTD_dictContentType_e dictContentType;
  uint uVar4;
  ZSTDMT_CCtx *pZVar5;
  bool bVar6;
  bool local_2b9;
  size_t err_code_4;
  size_t err_code_3;
  size_t flushMin;
  undefined4 uStack_248;
  int forceMaxProgress;
  undefined8 uStack_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  void *pvStack_1c0;
  size_t local_1b8;
  size_t err_code_2;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  void *pvStack_128;
  size_t local_120;
  size_t err_code_1;
  ZSTD_freeFunction local_110;
  void *local_108;
  ZSTD_compressionParameters local_fc;
  size_t local_e0;
  size_t err_code;
  ZSTD_prefixDict prefixDict;
  ZSTD_CCtx_params params;
  ZSTD_EndDirective endOp_local;
  ZSTD_inBuffer *input_local;
  ZSTD_outBuffer *output_local;
  ZSTD_CCtx *cctx_local;
  
  if (output->size < output->pos) {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffffff;
  }
  else if (input->size < input->pos) {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffffff;
  }
  else {
    if (cctx == (ZSTD_CCtx *)0x0) {
      __assert_fail("cctx!=NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x39a7,
                    "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
    if (cctx->streamStage == zcss_init) {
      memcpy(&prefixDict.dictContentType,&cctx->requestedParams,0x90);
      err_code = (size_t)(cctx->prefixDict).dict;
      prefixDict.dict = (void *)(cctx->prefixDict).dictSize;
      prefixDict.dictSize = *(size_t *)&(cctx->prefixDict).dictContentType;
      local_e0 = ZSTD_initLocalDict(cctx);
      uVar4 = ERR_isError(local_e0);
      if (uVar4 != 0) {
        return local_e0;
      }
      memset(&cctx->prefixDict,0,0x18);
      bVar6 = true;
      if (err_code != 0) {
        bVar6 = cctx->cdict == (ZSTD_CDict *)0x0;
      }
      if (!bVar6) {
        __assert_fail("prefixDict.dict==NULL || cctx->cdict==NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x39af,
                      "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
      if (endOp == ZSTD_e_end) {
        cctx->pledgedSrcSizePlusOne = input->size + 1;
      }
      ZSTD_getCParamsFromCCtxParams
                (&local_fc,&cctx->requestedParams,cctx->pledgedSrcSizePlusOne - 1,0);
      pvVar3 = prefixDict.dict;
      sVar2 = err_code;
      prefixDict._20_4_ = local_fc.windowLog;
      params.format = local_fc.chainLog;
      if (cctx->pledgedSrcSizePlusOne - 1 < 0x100001) {
        params.attachDictPref = ZSTD_dictDefaultAttach;
      }
      if ((int)params.attachDictPref < 1) {
        dictContentType = (ZSTD_dictContentType_e)prefixDict.dictSize;
        pZVar1 = cctx->cdict;
        memcpy(&stack0xfffffffffffffdb8,&prefixDict.dictContentType,0x90);
        params_01.cParams.chainLog = (undefined4)uStack_240;
        params_01.cParams.hashLog = uStack_240._4_4_;
        params_01.format = uStack_248;
        params_01.cParams.windowLog = forceMaxProgress;
        params_01.cParams.searchLog = (undefined4)uStack_238;
        params_01.cParams.minMatch = uStack_238._4_4_;
        params_01.cParams.targetLength = (undefined4)uStack_230;
        params_01.cParams.strategy = uStack_230._4_4_;
        params_01.fParams.contentSizeFlag = (undefined4)local_228;
        params_01.fParams.checksumFlag = local_228._4_4_;
        params_01.fParams.noDictIDFlag = (undefined4)uStack_220;
        params_01.compressionLevel = uStack_220._4_4_;
        params_01._48_8_ = uStack_218;
        params_01.targetCBlockSize = uStack_210;
        params_01.srcSizeHint = (undefined4)local_208;
        params_01.attachDictPref = local_208._4_4_;
        params_01.literalCompressionMode = (undefined4)uStack_200;
        params_01.nbWorkers = uStack_200._4_4_;
        params_01.jobSize = uStack_1f8;
        params_01.overlapLog = (undefined4)uStack_1f0;
        params_01.rsyncable = uStack_1f0._4_4_;
        params_01.ldmParams.enableLdm = (undefined4)uStack_1e8;
        params_01.ldmParams.hashLog = uStack_1e8._4_4_;
        params_01.ldmParams.bucketSizeLog = (undefined4)uStack_1e0;
        params_01.ldmParams.minMatchLength = uStack_1e0._4_4_;
        params_01.ldmParams.hashRateLog = (undefined4)local_1d8;
        params_01.ldmParams.windowLog = local_1d8._4_4_;
        params_01.customMem.customAlloc = (ZSTD_allocFunction)uStack_1d0;
        params_01.customMem.customFree = (ZSTD_freeFunction)uStack_1c8;
        params_01.customMem.opaque = pvStack_1c0;
        local_1b8 = ZSTD_resetCStream_internal
                              (cctx,(void *)sVar2,(size_t)pvVar3,dictContentType,pZVar1,params_01,
                               cctx->pledgedSrcSizePlusOne - 1);
        uVar4 = ERR_isError(local_1b8);
        if (uVar4 != 0) {
          return local_1b8;
        }
        if (cctx->streamStage != zcss_load) {
          __assert_fail("cctx->streamStage == zcss_load",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x39d0,
                        "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
        if ((cctx->appliedParams).nbWorkers != 0) {
          __assert_fail("cctx->appliedParams.nbWorkers == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x39d1,
                        "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
      }
      else {
        if (cctx->mtctx == (ZSTDMT_CCtx *)0x0) {
          err_code_1 = (size_t)(cctx->customMem).customAlloc;
          local_110 = (cctx->customMem).customFree;
          local_108 = (cctx->customMem).opaque;
          pZVar5 = ZSTDMT_createCCtx_advanced(params.attachDictPref,cctx->customMem);
          cctx->mtctx = pZVar5;
          if (cctx->mtctx == (ZSTDMT_CCtx *)0x0) {
            return 0xffffffffffffffc0;
          }
        }
        pvVar3 = prefixDict.dict;
        sVar2 = err_code;
        pZVar5 = cctx->mtctx;
        pZVar1 = cctx->cdict;
        memcpy(&err_code_2,&prefixDict.dictContentType,0x90);
        params_00.cParams.chainLog = (undefined4)uStack_1a8;
        params_00.cParams.hashLog = uStack_1a8._4_4_;
        params_00.format = (undefined4)err_code_2;
        params_00.cParams.windowLog = err_code_2._4_4_;
        params_00.cParams.searchLog = (undefined4)uStack_1a0;
        params_00.cParams.minMatch = uStack_1a0._4_4_;
        params_00.cParams.targetLength = (undefined4)uStack_198;
        params_00.cParams.strategy = uStack_198._4_4_;
        params_00.fParams.contentSizeFlag = (undefined4)local_190;
        params_00.fParams.checksumFlag = local_190._4_4_;
        params_00.fParams.noDictIDFlag = (undefined4)uStack_188;
        params_00.compressionLevel = uStack_188._4_4_;
        params_00._48_8_ = uStack_180;
        params_00.targetCBlockSize = uStack_178;
        params_00.srcSizeHint = (undefined4)local_170;
        params_00.attachDictPref = local_170._4_4_;
        params_00.literalCompressionMode = (undefined4)uStack_168;
        params_00.nbWorkers = uStack_168._4_4_;
        params_00.jobSize = uStack_160;
        params_00.overlapLog = (undefined4)uStack_158;
        params_00.rsyncable = uStack_158._4_4_;
        params_00.ldmParams.enableLdm = (undefined4)uStack_150;
        params_00.ldmParams.hashLog = uStack_150._4_4_;
        params_00.ldmParams.bucketSizeLog = (undefined4)uStack_148;
        params_00.ldmParams.minMatchLength = uStack_148._4_4_;
        params_00.ldmParams.hashRateLog = (undefined4)local_140;
        params_00.ldmParams.windowLog = local_140._4_4_;
        params_00.customMem.customAlloc = (ZSTD_allocFunction)uStack_138;
        params_00.customMem.customFree = (ZSTD_freeFunction)uStack_130;
        params_00.customMem.opaque = pvStack_128;
        local_120 = ZSTDMT_initCStream_internal
                              (pZVar5,(void *)sVar2,(size_t)pvVar3,ZSTD_dct_rawContent,pZVar1,
                               params_00,cctx->pledgedSrcSizePlusOne - 1);
        uVar4 = ERR_isError(local_120);
        if (uVar4 != 0) {
          return local_120;
        }
        cctx->streamStage = zcss_load;
        (cctx->appliedParams).nbWorkers = params.attachDictPref;
      }
    }
    if ((cctx->appliedParams).nbWorkers < 1) {
      cctx_local = (ZSTD_CCtx *)ZSTD_compressStream_generic(cctx,output,input,endOp);
      uVar4 = ERR_isError((size_t)cctx_local);
      if (uVar4 == 0) {
        cctx_local = (ZSTD_CCtx *)(cctx->outBuffContentSize - cctx->outBuffFlushedSize);
      }
    }
    else {
      local_2b9 = endOp == ZSTD_e_flush || endOp == ZSTD_e_end;
      if ((endOp != ZSTD_e_flush && endOp != ZSTD_e_end) && endOp != ZSTD_e_continue) {
        __assert_fail("forceMaxProgress || endOp == ZSTD_e_continue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x39da,
                      "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
      if (cctx->cParamsChanged != 0) {
        ZSTDMT_updateCParams_whileCompressing(cctx->mtctx,&cctx->requestedParams);
        cctx->cParamsChanged = 0;
      }
      do {
        cctx_local = (ZSTD_CCtx *)ZSTDMT_compressStream_generic(cctx->mtctx,output,input,endOp);
        uVar4 = ZSTD_isError((size_t)cctx_local);
        if ((uVar4 != 0) || ((endOp == ZSTD_e_end && (cctx_local == (ZSTD_CCtx *)0x0)))) {
          ZSTD_CCtx_reset(cctx,ZSTD_reset_session_only);
        }
        uVar4 = ERR_isError((size_t)cctx_local);
        if (uVar4 != 0) {
          return (size_t)cctx_local;
        }
        bVar6 = false;
        if ((local_2b9) && (bVar6 = false, cctx_local != (ZSTD_CCtx *)0x0)) {
          bVar6 = output->pos < output->size;
        }
      } while (bVar6);
      bVar6 = true;
      if ((local_2b9) && (bVar6 = true, cctx_local != (ZSTD_CCtx *)0x0)) {
        bVar6 = output->pos == output->size;
      }
      if (!bVar6) {
        __assert_fail("!forceMaxProgress || flushMin == 0 || output->pos == output->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x39eb,
                      "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
    }
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, GENERIC);
    RETURN_ERROR_IF(input->pos  > input->size, GENERIC);
    assert(cctx!=NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        ZSTD_CCtx_params params = cctx->requestedParams;
        ZSTD_prefixDict const prefixDict = cctx->prefixDict;
        FORWARD_IF_ERROR( ZSTD_initLocalDict(cctx) ); /* Init the local dict if present. */
        memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));   /* single usage */
        assert(prefixDict.dict==NULL || cctx->cdict==NULL);    /* only one can be set */
        DEBUGLOG(4, "ZSTD_compressStream2 : transparent init stage");
        if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = input->size + 1;  /* auto-fix pledgedSrcSize */
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &cctx->requestedParams, cctx->pledgedSrcSizePlusOne-1, 0 /*dictSize*/);


#ifdef ZSTD_MULTITHREAD
        if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
            params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
        }
        if (params.nbWorkers > 0) {
            /* mt context creation */
            if (cctx->mtctx == NULL) {
                DEBUGLOG(4, "ZSTD_compressStream2: creating new mtctx for nbWorkers=%u",
                            params.nbWorkers);
                cctx->mtctx = ZSTDMT_createCCtx_advanced((U32)params.nbWorkers, cctx->customMem);
                RETURN_ERROR_IF(cctx->mtctx == NULL, memory_allocation);
            }
            /* mt compression */
            DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
            FORWARD_IF_ERROR( ZSTDMT_initCStream_internal(
                        cctx->mtctx,
                        prefixDict.dict, prefixDict.dictSize, ZSTD_dct_rawContent,
                        cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) );
            cctx->streamStage = zcss_load;
            cctx->appliedParams.nbWorkers = params.nbWorkers;
        } else
#endif
        {   FORWARD_IF_ERROR( ZSTD_resetCStream_internal(cctx,
                            prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                            cctx->cdict,
                            params, cctx->pledgedSrcSizePlusOne-1) );
            assert(cctx->streamStage == zcss_load);
            assert(cctx->appliedParams.nbWorkers == 0);
    }   }
    /* end of transparent initialization stage */

    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        int const forceMaxProgress = (endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
        size_t flushMin;
        assert(forceMaxProgress || endOp == ZSTD_e_continue /* Protection for a new flush type */);
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        do {
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin);
        } while (forceMaxProgress && flushMin != 0 && output->pos < output->size);
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(!forceMaxProgress || flushMin == 0 || output->pos == output->size);
        return flushMin;
    }
#endif
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) );
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}